

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::mouseDoubleClickEvent(QGraphicsView *this,QMouseEvent *event)

{
  bool bVar1;
  byte bVar2;
  MouseButton MVar3;
  MouseEventFlags flags;
  QGraphicsViewPrivate *pQVar4;
  QObject *pQVar5;
  QMouseEvent *pQVar6;
  QPoint *in_RSI;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  bool isAccepted;
  QGraphicsViewPrivate *d;
  QGraphicsSceneMouseEvent mouseEvent;
  undefined4 in_stack_ffffffffffffff58;
  MouseEventSource in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff68;
  QFlagsStorage<Qt::KeyboardModifier> in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  QGraphicsViewPrivate *this_00;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  QPointF local_48;
  QPoint local_38;
  QPointF local_30;
  QPointF local_20;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar4 = d_func((QGraphicsView *)0xa3d935);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3d94b);
  if ((bVar1) && ((*(uint *)&pQVar4->field_0x300 & 1) != 0)) {
    QGraphicsViewPrivate::storeMouseEvent
              (in_RDI,(QMouseEvent *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_20 = QSinglePointEvent::position((QSinglePointEvent *)0xa3d982);
    local_10 = QPointF::toPoint((QPointF *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    pQVar4->mousePressViewPoint = local_10;
    local_30 = mapToScene((QGraphicsView *)this_00,in_RSI);
    (pQVar4->mousePressScenePoint).xp = local_30.xp;
    (pQVar4->mousePressScenePoint).yp = local_30.yp;
    local_48 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0xa3da0c);
    local_38 = QPointF::toPoint((QPointF *)
                                CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    pQVar4->mousePressScreenPoint = local_38;
    (pQVar4->lastMouseMoveScenePoint).xp = (pQVar4->mousePressScenePoint).xp;
    (pQVar4->lastMouseMoveScenePoint).yp = (pQVar4->mousePressScenePoint).yp;
    pQVar4->lastMouseMoveScreenPoint = pQVar4->mousePressScreenPoint;
    MVar3 = QSinglePointEvent::button((QSinglePointEvent *)in_RSI);
    pQVar4->mousePressButton = MVar3;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent
              ((QGraphicsSceneMouseEvent *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c.i);
    QAbstractScrollArea::viewport((QAbstractScrollArea *)in_RDI);
    QGraphicsSceneEvent::setWidget
              ((QGraphicsSceneEvent *)in_RDI,
               (QWidget *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QGraphicsSceneMouseEvent::setButtonDownScenePos
              ((QGraphicsSceneMouseEvent *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (MouseButton)((ulong)pQVar4 >> 0x20),
               (QPointF *)CONCAT44(in_stack_ffffffffffffff6c.i,in_stack_ffffffffffffff68));
    QGraphicsSceneMouseEvent::setButtonDownScreenPos
              ((QGraphicsSceneMouseEvent *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (MouseButton)((ulong)pQVar4 >> 0x20),
               (QPoint *)CONCAT44(in_stack_ffffffffffffff6c.i,in_stack_ffffffffffffff68));
    mapToScene((QGraphicsView *)this_00,in_RSI);
    QGraphicsSceneMouseEvent::setScenePos
              ((QGraphicsSceneMouseEvent *)in_RDI,
               (QPointF *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QGraphicsSceneMouseEvent::setScreenPos
              ((QGraphicsSceneMouseEvent *)in_RDI,
               (QPoint *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QGraphicsSceneMouseEvent::setLastScenePos
              ((QGraphicsSceneMouseEvent *)in_RDI,
               (QPointF *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QGraphicsSceneMouseEvent::setLastScreenPos
              ((QGraphicsSceneMouseEvent *)in_RDI,
               (QPoint *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QSinglePointEvent::buttons((QSinglePointEvent *)in_RDI);
    QGraphicsSceneMouseEvent::setButtons
              ((QGraphicsSceneMouseEvent *)in_RDI,(MouseButtons)in_stack_ffffffffffffff6c.i);
    QEvent::setAccepted((QEvent *)&local_60,false);
    QSinglePointEvent::button((QSinglePointEvent *)in_RSI);
    QGraphicsSceneMouseEvent::setButton
              ((QGraphicsSceneMouseEvent *)in_RDI,in_stack_ffffffffffffff5c);
    QInputEvent::modifiers((QInputEvent *)in_RDI);
    QGraphicsSceneMouseEvent::setModifiers
              ((QGraphicsSceneMouseEvent *)in_RDI,(KeyboardModifiers)in_stack_ffffffffffffff6c.i);
    QMouseEvent::source();
    QGraphicsSceneMouseEvent::setSource
              ((QGraphicsSceneMouseEvent *)in_RDI,in_stack_ffffffffffffff5c);
    flags.super_QFlagsStorageHelper<Qt::MouseEventFlag,_4>.super_QFlagsStorage<Qt::MouseEventFlag>.i
         = (QFlagsStorageHelper<Qt::MouseEventFlag,_4>)QMouseEvent::flags();
    QGraphicsSceneMouseEvent::setFlags((QGraphicsSceneMouseEvent *)in_RDI,flags);
    QInputEvent::timestamp((QInputEvent *)in_RSI);
    QGraphicsSceneEvent::setTimestamp
              ((QGraphicsSceneEvent *)in_RDI,
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    bVar1 = QEvent::spontaneous((QEvent *)in_RSI);
    if (bVar1) {
      ::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3dc50);
      qt_sendSpontaneousEvent
                ((QObject *)in_RDI,
                 (QEvent *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    else {
      pQVar5 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3dc70)->
                super_QObject;
      QCoreApplication::sendEvent(pQVar5,(QEvent *)&local_60);
    }
    bVar2 = QEvent::isAccepted((QEvent *)&local_60);
    (**(code **)((long)*in_RSI + 0x10))(in_RSI,bVar2);
    pQVar6 = QEventStorage<QMouseEvent>::operator->(&pQVar4->lastMouseEvent);
    (**(code **)(*(long *)pQVar6 + 0x10))(pQVar6,bVar2 & 1);
    QGraphicsSceneMouseEvent::~QGraphicsSceneMouseEvent((QGraphicsSceneMouseEvent *)0xa3dcd0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::mouseDoubleClickEvent(QMouseEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene || !d->sceneInteractionAllowed)
        return;

    d->storeMouseEvent(event);
    d->mousePressViewPoint = event->position().toPoint();
    d->mousePressScenePoint = mapToScene(d->mousePressViewPoint);
    d->mousePressScreenPoint = event->globalPosition().toPoint();
    d->lastMouseMoveScenePoint = d->mousePressScenePoint;
    d->lastMouseMoveScreenPoint = d->mousePressScreenPoint;
    d->mousePressButton = event->button();

    QGraphicsSceneMouseEvent mouseEvent(QEvent::GraphicsSceneMouseDoubleClick);
    mouseEvent.setWidget(viewport());
    mouseEvent.setButtonDownScenePos(d->mousePressButton, d->mousePressScenePoint);
    mouseEvent.setButtonDownScreenPos(d->mousePressButton, d->mousePressScreenPoint);
    mouseEvent.setScenePos(mapToScene(d->mousePressViewPoint));
    mouseEvent.setScreenPos(d->mousePressScreenPoint);
    mouseEvent.setLastScenePos(d->lastMouseMoveScenePoint);
    mouseEvent.setLastScreenPos(d->lastMouseMoveScreenPoint);
    mouseEvent.setButtons(event->buttons());
    mouseEvent.setAccepted(false);
    mouseEvent.setButton(event->button());
    mouseEvent.setModifiers(event->modifiers());
    mouseEvent.setSource(event->source());
    mouseEvent.setFlags(event->flags());
    mouseEvent.setTimestamp(event->timestamp());
    if (event->spontaneous())
        qt_sendSpontaneousEvent(d->scene, &mouseEvent);
    else
        QCoreApplication::sendEvent(d->scene, &mouseEvent);

    // Update the original mouse event accepted state.
    const bool isAccepted = mouseEvent.isAccepted();
    event->setAccepted(isAccepted);

    // Update the last mouse event accepted state.
    d->lastMouseEvent->setAccepted(isAccepted);
}